

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O2

Var Js::SharedArrayBuffer::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint32 length;
  undefined4 *puVar5;
  Var instance;
  Var value;
  SharedArrayBuffer *obj;
  RecyclableObject *constructor;
  int in_stack_00000010;
  Arguments local_50;
  undefined1 auStack_40 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                ,0x4e,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00be9e2d;
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)auStack_40,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((auStack_40._0_4_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                ,0x51,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar3) {
LAB_00be9e2d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  instance = Arguments::GetNewTarget((Arguments *)auStack_40);
  local_50.Values = (Type)args.super_Arguments.Info;
  bVar3 = JavascriptOperators::GetAndAssertIsConstructorSuperCall(&local_50);
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    if (instance != (Var)0x0) {
      BVar4 = JavascriptOperators::IsUndefinedObject(instance);
      if (BVar4 != 0) goto LAB_00be9e19;
    }
    if ((auStack_40._0_4_ & 0xfffffe) == 0) {
      length = 0;
    }
    else {
      value = Arguments::operator[]((Arguments *)auStack_40,1);
      length = ArrayBuffer::ToIndex(value,-0x7ff5ec5b,pSVar1,0x7fffffff,true);
    }
    obj = JavascriptLibrary::CreateSharedArrayBuffer
                    ((pSVar1->super_ScriptContextBase).javascriptLibrary,length);
    if (bVar3) {
      constructor = VarTo<Js::RecyclableObject>(instance);
      obj = (SharedArrayBuffer *)
            JavascriptOperators::OrdinaryCreateFromConstructor
                      (constructor,(RecyclableObject *)obj,(DynamicObject *)0x0,pSVar1);
    }
    return obj;
  }
LAB_00be9e19:
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ea00,L"SharedArrayBuffer");
}

Assistant:

Var SharedArrayBuffer::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        Var newTarget = args.GetNewTarget();
        bool isCtorSuperCall = JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);

        if (!(callInfo.Flags & CallFlags_New) || (newTarget && JavascriptOperators::IsUndefinedObject(newTarget)))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ClassConstructorCannotBeCalledWithoutNew, _u("SharedArrayBuffer"));
        }

        uint32 byteLength = 0;
        if (args.Info.Count > 1)
        {
            byteLength = ArrayBuffer::ToIndex(args[1], JSERR_ArrayLengthConstructIncorrect, scriptContext, MaxSharedArrayBufferLength);
        }

        RecyclableObject* newArr = scriptContext->GetLibrary()->CreateSharedArrayBuffer(byteLength);

        return isCtorSuperCall ?
            JavascriptOperators::OrdinaryCreateFromConstructor(VarTo<RecyclableObject>(newTarget), newArr, nullptr, scriptContext) :
            newArr;
    }